

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetCFLFraction(void *arkode_mem,sunrealtype cfl_frac)

{
  int error_code;
  int line;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  
  error_code = arkAccessHAdaptMem(arkode_mem,"ARKodeSetCFLFraction",&ark_mem,&hadapt_mem);
  if (error_code == 0) {
    if (ark_mem->step_supports_adaptive == 0) {
      msgfmt = "time-stepping module does not support temporal adaptivity";
      error_code = -0x30;
      line = 0x5fc;
    }
    else {
      if (cfl_frac < 1.0) {
        if (cfl_frac <= 0.0) {
          hadapt_mem->cfl = 0.5;
        }
        else {
          hadapt_mem->cfl = cfl_frac;
        }
        return 0;
      }
      msgfmt = "Illegal CFL fraction";
      error_code = -0x16;
      line = 0x604;
    }
    arkProcessError(ark_mem,error_code,line,"ARKodeSetCFLFraction",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
  }
  return error_code;
}

Assistant:

int ARKodeSetCFLFraction(void* arkode_mem, sunrealtype cfl_frac)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* check for allowable parameters */
  if (cfl_frac >= ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal CFL fraction");
    return (ARK_ILL_INPUT);
  }

  /* set positive-valued parameters, otherwise set default */
  if (cfl_frac <= ZERO) { hadapt_mem->cfl = CFLFAC; }
  else { hadapt_mem->cfl = cfl_frac; }

  return (ARK_SUCCESS);
}